

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

char * param_type_as_str(ParamType type)

{
  char *pcStack_10;
  ParamType type_local;
  
  switch(type) {
  case TYPED_PARAM_DOUBLE:
    pcStack_10 = "DOUBLE";
    break;
  case TYPED_PARAM_FLOAT:
    pcStack_10 = "FLOAT";
    break;
  case TYPED_PARAM_BOOL:
    pcStack_10 = "BOOL";
    break;
  case TYPED_PARAM_INT32:
    pcStack_10 = "INT32";
    break;
  case TYPED_PARAM_USIZE:
    pcStack_10 = "USIZE";
    break;
  case TYPED_PARAM_STR:
    pcStack_10 = "STR";
    break;
  default:
    __assert_fail("!\"Invalid code path\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                  ,0x9d,"const char *param_type_as_str(ParamType)");
  }
  return pcStack_10;
}

Assistant:

const char *param_type_as_str(ParamType type) {
    switch (type) {
    case TYPED_PARAM_DOUBLE:
        return "DOUBLE";
    case TYPED_PARAM_FLOAT:
        return "FLOAT";
    case TYPED_PARAM_BOOL:
        return "BOOL";
    case TYPED_PARAM_INT32:
        return "INT32";
    case TYPED_PARAM_USIZE:
        return "USIZE";
    case TYPED_PARAM_STR:
        return "STR";
    }

    assert(!"Invalid code path");
    return "<UNKNOWN>";
}